

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O2

void __thiscall wabt::ModuleContext::BeginFunc(ModuleContext *this,Func *func)

{
  LabelType local_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  std::vector<wabt::Label,_std::allocator<wabt::Label>_>::clear(&this->label_stack_);
  local_6c = First;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Label,std::allocator<wabt::Label>>::
  emplace_back<wabt::LabelType,std::__cxx11::string,std::vector<wabt::Type,std::allocator<wabt::Type>>,std::vector<wabt::Type,std::allocator<wabt::Type>>const&>
            ((vector<wabt::Label,std::allocator<wabt::Label>> *)&this->label_stack_,&local_6c,
             &local_68,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_48,
             &(func->decl).sig.result_types);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_48);
  std::__cxx11::string::_M_dispose();
  this->current_func_ = func;
  return;
}

Assistant:

void ModuleContext::BeginFunc(const Func& func) {
  label_stack_.clear();
  label_stack_.emplace_back(LabelType::Func, std::string(), TypeVector(),
                            func.decl.sig.result_types);
  current_func_ = &func;
}